

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PxVector.h
# Opt level: O2

vector<HACD::ChUll_*> * __thiscall
hacd::vector<HACD::ChUll_*>::operator=(vector<HACD::ChUll_*> *this,vector<HACD::ChUll_*> *rhs)

{
  ChUll **ppCVar1;
  uint uVar2;
  ChUll *pCVar3;
  ChUll **ppCVar4;
  ChUll **ppCVar5;
  
  if (rhs != this) {
    this->mSize = 0;
    reserve(this,rhs->mSize);
    ppCVar4 = this->mData;
    uVar2 = rhs->mSize;
    ppCVar5 = rhs->mData;
    ppCVar1 = ppCVar4 + uVar2;
    for (; ppCVar4 < ppCVar1; ppCVar4 = ppCVar4 + 1) {
      pCVar3 = *ppCVar5;
      ppCVar5 = ppCVar5 + 1;
      *ppCVar4 = pCVar3;
    }
    this->mSize = uVar2;
  }
  return this;
}

Assistant:

HACD_INLINE vector& operator= (const vector<T>& rhs)
		{
			if(&rhs == this)
				return *this;

			clear();
			reserve(rhs.mSize);
			copy(mData, mData + rhs.mSize, rhs.mData);

			mSize = rhs.mSize;
			return *this;
		}